

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_msl.cpp
# Opt level: O1

void __thiscall
spirv_cross::CompilerMSL::entry_point_args_builtin(CompilerMSL *this,string *ep_args)

{
  _func_void *p_Var1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  ID id;
  IndexType IVar3;
  uint uVar4;
  size_t sVar5;
  TypedID<(spirv_cross::Types)0> *pTVar6;
  Variant *pVVar7;
  char cVar8;
  bool bVar9;
  char cVar10;
  BuiltIn bi_type;
  uint32_t uVar11;
  ExecutionModel EVar12;
  uint32_t uVar13;
  SPIRVariable *pSVar14;
  SPIRType *pSVar15;
  long *plVar16;
  undefined8 *puVar17;
  ulong uVar18;
  SPIREntryPoint *pSVar19;
  size_type sVar20;
  SPIRConstant *pSVar21;
  SPIRFunction *pSVar22;
  runtime_error *prVar23;
  size_type *psVar24;
  CompilerMSL *pCVar25;
  ulong *puVar26;
  uint uVar27;
  long lVar28;
  pair<spirv_cross::SPIRVariable_*,_spv::BuiltIn> *ppVar29;
  undefined8 uVar30;
  string *in_R8;
  pair<spirv_cross::SPIRVariable_*,_spv::BuiltIn> *var;
  pair<spirv_cross::SPIRVariable_*,_spv::BuiltIn> *ppVar31;
  undefined8 in_stack_fffffffffffffe68;
  undefined1 local_188 [24];
  string local_170;
  string __str;
  string local_120;
  string local_100;
  LoopLock local_e0;
  _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  *local_d8;
  ParsedIR *local_d0;
  SmallVector<std::pair<spirv_cross::SPIRVariable_*,_spv::BuiltIn>,_8UL> active_builtins;
  
  active_builtins.super_VectorView<std::pair<spirv_cross::SPIRVariable_*,_spv::BuiltIn>_>.ptr =
       (pair<spirv_cross::SPIRVariable_*,_spv::BuiltIn> *)&active_builtins.stack_storage;
  active_builtins.super_VectorView<std::pair<spirv_cross::SPIRVariable_*,_spv::BuiltIn>_>.
  buffer_size = 0;
  active_builtins.buffer_capacity = 8;
  local_d0 = &(this->super_CompilerGLSL).super_Compiler.ir;
  ParsedIR::create_loop_hard_lock(local_d0);
  sVar5 = (this->super_CompilerGLSL).super_Compiler.ir.ids_for_type[2].
          super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)0>_>.buffer_size;
  if (sVar5 != 0) {
    pTVar6 = (this->super_CompilerGLSL).super_Compiler.ir.ids_for_type[2].
             super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)0>_>.ptr;
    local_d8 = &(this->super_CompilerGLSL).super_Compiler.active_input_builtins.higher._M_h;
    lVar28 = 0;
    do {
      id.id = *(uint32_t *)((long)&pTVar6->id + lVar28);
      pVVar7 = (this->super_CompilerGLSL).super_Compiler.ir.ids.
               super_VectorView<spirv_cross::Variant>.ptr;
      if ((pVVar7[id.id].type == TypeVariable) &&
         (pSVar14 = Variant::get<spirv_cross::SPIRVariable>(pVVar7 + id.id),
         pSVar14->storage == StorageClassInput)) {
        bi_type = Compiler::get_decoration((Compiler *)this,id,DecorationBuiltIn);
        bVar9 = Compiler::is_builtin_variable((Compiler *)this,pSVar14);
        if ((bVar9) &&
           ((pSVar15 = Compiler::get_variable_data_type((Compiler *)this,pSVar14),
            *(int *)&(pSVar15->super_IVariant).field_0xc != 0xf &&
            (pSVar15 = Compiler::get_variable_data_type((Compiler *)this,pSVar14),
            *(int *)&(pSVar15->super_IVariant).field_0xc != 0x15)))) {
          in_stack_fffffffffffffe68._4_4_ = (undefined4)((ulong)in_stack_fffffffffffffe68 >> 0x20);
          in_stack_fffffffffffffe68._0_4_ = bi_type;
          if (bi_type < 0x40) {
            uVar18 = 1L << ((byte)bi_type & 0x3f) &
                     (this->super_CompilerGLSL).super_Compiler.active_input_builtins.lower;
          }
          else {
            uVar18 = ::std::
                     _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                     ::count(local_d8,(key_type *)&stack0xfffffffffffffe68);
          }
          if ((uVar18 == 0) ||
             (bVar9 = Compiler::interface_variable_exists_in_entry_point((Compiler *)this,id.id),
             !bVar9)) goto LAB_002dfa90;
          SmallVector<std::pair<spirv_cross::SPIRVariable_*,_spv::BuiltIn>,_8UL>::reserve
                    (&active_builtins,
                     active_builtins.
                     super_VectorView<std::pair<spirv_cross::SPIRVariable_*,_spv::BuiltIn>_>.
                     buffer_size + 1);
          active_builtins.super_VectorView<std::pair<spirv_cross::SPIRVariable_*,_spv::BuiltIn>_>.
          ptr[active_builtins.
              super_VectorView<std::pair<spirv_cross::SPIRVariable_*,_spv::BuiltIn>_>.buffer_size].
          first = pSVar14;
          active_builtins.super_VectorView<std::pair<spirv_cross::SPIRVariable_*,_spv::BuiltIn>_>.
          ptr[active_builtins.
              super_VectorView<std::pair<spirv_cross::SPIRVariable_*,_spv::BuiltIn>_>.buffer_size].
          second = bi_type;
          active_builtins.super_VectorView<std::pair<spirv_cross::SPIRVariable_*,_spv::BuiltIn>_>.
          buffer_size = active_builtins.
                        super_VectorView<std::pair<spirv_cross::SPIRVariable_*,_spv::BuiltIn>_>.
                        buffer_size + 1;
          bVar9 = is_direct_input_builtin(this,bi_type);
          if (!bVar9) goto LAB_002df595;
          if (ep_args->_M_string_length != 0) {
            ::std::__cxx11::string::append((char *)ep_args);
          }
          this->builtin_declaration = true;
          if ((bi_type == BuiltInTessCoord) &&
             (pSVar19 = Compiler::get_entry_point((Compiler *)this),
             ((pSVar19->flags).lower & 0x1000000) != 0)) {
            CompilerGLSL::to_expression_abi_cxx11_(&__str,&this->super_CompilerGLSL,id.id,true);
            puVar17 = (undefined8 *)
                      ::std::__cxx11::string::replace((ulong)&__str,0,(char *)0x0,0x37da97);
            local_170._M_dataplus._M_p = (pointer)&local_170.field_2;
            puVar26 = puVar17 + 2;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*puVar17 ==
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)puVar26) {
              local_170.field_2._M_allocated_capacity = *puVar26;
              local_170.field_2._8_8_ = puVar17[3];
            }
            else {
              local_170.field_2._M_allocated_capacity = *puVar26;
              local_170._M_dataplus._M_p = (pointer)*puVar17;
            }
            local_170._M_string_length = puVar17[1];
            *puVar17 = puVar26;
            puVar17[1] = 0;
            *(undefined1 *)(puVar17 + 2) = 0;
            plVar16 = (long *)::std::__cxx11::string::append((char *)&local_170);
            uVar30 = local_188;
            psVar24 = (size_type *)(plVar16 + 2);
            if ((size_type *)*plVar16 == psVar24) {
              local_188._0_8_ = *psVar24;
              local_188._8_8_ = plVar16[3];
            }
            else {
              local_188._0_8_ = *psVar24;
              uVar30 = (size_type *)*plVar16;
            }
            *plVar16 = (long)psVar24;
            plVar16[1] = 0;
            *(undefined1 *)(plVar16 + 2) = 0;
            ::std::__cxx11::string::_M_append((char *)ep_args,uVar30);
            if ((undefined1 *)uVar30 != local_188) {
              operator_delete((void *)uVar30);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_170._M_dataplus._M_p != &local_170.field_2) {
              operator_delete(local_170._M_dataplus._M_p);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)__str._M_dataplus._M_p != &__str.field_2) {
LAB_002dfe0a:
              operator_delete(__str._M_dataplus._M_p);
            }
          }
          else {
            builtin_type_decl_abi_cxx11_(&__str,this,bi_type,id.id);
            puVar17 = (undefined8 *)::std::__cxx11::string::append((char *)&__str);
            local_170._M_dataplus._M_p = (pointer)&local_170.field_2;
            puVar26 = puVar17 + 2;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*puVar17 ==
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)puVar26) {
              local_170.field_2._M_allocated_capacity = *puVar26;
              local_170.field_2._8_8_ = puVar17[3];
            }
            else {
              local_170.field_2._M_allocated_capacity = *puVar26;
              local_170._M_dataplus._M_p = (pointer)*puVar17;
            }
            local_170._M_string_length = puVar17[1];
            *puVar17 = puVar26;
            puVar17[1] = 0;
            *(undefined1 *)(puVar17 + 2) = 0;
            CompilerGLSL::to_expression_abi_cxx11_(&local_120,&this->super_CompilerGLSL,id.id,true);
            uVar30 = 0xf;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_170._M_dataplus._M_p != &local_170.field_2) {
              uVar30 = local_170.field_2._M_allocated_capacity;
            }
            if ((ulong)uVar30 < local_120._M_string_length + local_170._M_string_length) {
              uVar30 = 0xf;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_120._M_dataplus._M_p != &local_120.field_2) {
                uVar30 = local_120.field_2._M_allocated_capacity;
              }
              if ((ulong)uVar30 < local_120._M_string_length + local_170._M_string_length)
              goto LAB_002dfc21;
              puVar17 = (undefined8 *)
                        ::std::__cxx11::string::replace
                                  ((ulong)&local_120,0,(char *)0x0,(ulong)local_170._M_dataplus._M_p
                                  );
            }
            else {
LAB_002dfc21:
              puVar17 = (undefined8 *)
                        ::std::__cxx11::string::_M_append
                                  ((char *)&local_170,(ulong)local_120._M_dataplus._M_p);
            }
            uVar30 = local_188;
            p_Var1 = (_func_void *)(puVar17 + 2);
            if ((_func_void *)*puVar17 == p_Var1) {
              local_188._0_8_ = *(undefined8 *)p_Var1;
              local_188._8_8_ = puVar17[3];
            }
            else {
              local_188._0_8_ = *(undefined8 *)p_Var1;
              uVar30 = (_func_void *)*puVar17;
            }
            *puVar17 = p_Var1;
            puVar17[1] = 0;
            *p_Var1 = (_func_void)0x0;
            ::std::__cxx11::string::_M_append((char *)ep_args,uVar30);
            if ((undefined1 *)uVar30 != local_188) {
              operator_delete((void *)uVar30);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_120._M_dataplus._M_p != &local_120.field_2) {
              operator_delete(local_120._M_dataplus._M_p);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_170._M_dataplus._M_p != &local_170.field_2) {
              operator_delete(local_170._M_dataplus._M_p);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)__str._M_dataplus._M_p != &__str.field_2) goto LAB_002dfe0a;
          }
          builtin_qualifier_abi_cxx11_(&local_170,this,bi_type);
          in_R8 = (string *)0x3;
          plVar16 = (long *)::std::__cxx11::string::replace
                                      ((ulong)&local_170,0,(char *)0x0,0x37affd);
          in_stack_fffffffffffffe68 = local_188;
          pCVar25 = (CompilerMSL *)(plVar16 + 2);
          if ((CompilerMSL *)*plVar16 == pCVar25) {
            local_188._0_8_ = (pCVar25->super_CompilerGLSL).super_Compiler._vptr_Compiler;
            local_188._8_8_ = plVar16[3];
          }
          else {
            local_188._0_8_ = (pCVar25->super_CompilerGLSL).super_Compiler._vptr_Compiler;
            in_stack_fffffffffffffe68 = (CompilerMSL *)*plVar16;
          }
          *plVar16 = (long)pCVar25;
          plVar16[1] = 0;
          *(undefined1 *)(plVar16 + 2) = 0;
          ::std::__cxx11::string::_M_append((char *)ep_args,in_stack_fffffffffffffe68);
          if ((CompilerMSL *)in_stack_fffffffffffffe68 != (CompilerMSL *)local_188) {
            operator_delete((void *)in_stack_fffffffffffffe68);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_170._M_dataplus._M_p != &local_170.field_2) {
            operator_delete(local_170._M_dataplus._M_p);
          }
          if (bi_type == BuiltInSampleMask) {
            pSVar19 = Compiler::get_entry_point((Compiler *)this);
            in_stack_fffffffffffffe68._4_4_ = (undefined4)((ulong)in_stack_fffffffffffffe68 >> 0x20)
            ;
            in_stack_fffffffffffffe68._0_4_ = 0x115e;
            sVar20 = ::std::
                     _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                     ::count(&(pSVar19->flags).higher._M_h,(key_type *)&stack0xfffffffffffffe68);
            if (sVar20 != 0) {
              uVar4 = (this->msl_options).msl_version;
              if (uVar4 < 20000) {
                prVar23 = (runtime_error *)__cxa_allocate_exception(0x10);
                ::std::__cxx11::string::_M_construct<char_const*>
                          ((string *)&stack0xfffffffffffffe68,
                           "Post-depth coverage requires MSL 2.0.","");
                ::std::runtime_error::runtime_error(prVar23,(string *)&stack0xfffffffffffffe68);
                *(undefined ***)prVar23 = &PTR__runtime_error_003fce08;
                __cxa_throw(prVar23,&CompilerError::typeinfo,::std::runtime_error::~runtime_error);
              }
              if ((uVar4 < 0x4f4c) && ((this->msl_options).platform == macOS)) {
                prVar23 = (runtime_error *)__cxa_allocate_exception(0x10);
                ::std::__cxx11::string::_M_construct<char_const*>
                          ((string *)&stack0xfffffffffffffe68,
                           "Post-depth coverage on Mac requires MSL 2.3.","");
                ::std::runtime_error::runtime_error(prVar23,(string *)&stack0xfffffffffffffe68);
                *(undefined ***)prVar23 = &PTR__runtime_error_003fce08;
                __cxa_throw(prVar23,&CompilerError::typeinfo,::std::runtime_error::~runtime_error);
              }
              ::std::__cxx11::string::append((char *)ep_args);
            }
          }
          ::std::__cxx11::string::append((char *)ep_args);
          this->builtin_declaration = false;
        }
LAB_002df595:
        bVar9 = Compiler::has_extended_decoration
                          ((Compiler *)this,id.id,SPIRVCrossDecorationBuiltInDispatchBase);
        if (bVar9) {
          if ((this->msl_options).msl_version < 0x27d8) {
            __assert_fail("msl_options.supports_msl_version(1, 2)",
                          "/workspace/llm4binary/github/license_c_cmakelists/EpicGames[P]SPIRV-Cross/spirv_msl.cpp"
                          ,0x316a,
                          "auto spirv_cross::CompilerMSL::entry_point_args_builtin(string &)::(anonymous class)::operator()(uint32_t, SPIRVariable &) const"
                         );
          }
          if (ep_args->_M_string_length != 0) {
            ::std::__cxx11::string::append((char *)ep_args);
          }
          pSVar15 = Compiler::get_variable_data_type((Compiler *)this,pSVar14);
          (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x13])
                    (&local_120,this,pSVar15,0);
          plVar16 = (long *)::std::__cxx11::string::append((char *)&local_120);
          __str._M_dataplus._M_p = (pointer)&__str.field_2;
          psVar24 = (size_type *)(plVar16 + 2);
          if ((size_type *)*plVar16 == psVar24) {
            __str.field_2._M_allocated_capacity = *psVar24;
            __str.field_2._8_8_ = plVar16[3];
          }
          else {
            __str.field_2._M_allocated_capacity = *psVar24;
            __str._M_dataplus._M_p = (pointer)*plVar16;
          }
          __str._M_string_length = plVar16[1];
          *plVar16 = (long)psVar24;
          plVar16[1] = 0;
          *(undefined1 *)(plVar16 + 2) = 0;
          CompilerGLSL::to_expression_abi_cxx11_(&local_100,&this->super_CompilerGLSL,id.id,true);
          uVar30 = 0xf;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)__str._M_dataplus._M_p != &__str.field_2) {
            uVar30 = __str.field_2._M_allocated_capacity;
          }
          in_R8 = (string *)__str._M_string_length;
          if ((ulong)uVar30 < local_100._M_string_length + __str._M_string_length) {
            uVar30 = 0xf;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_100._M_dataplus._M_p != &local_100.field_2) {
              uVar30 = local_100.field_2._M_allocated_capacity;
            }
            if ((ulong)uVar30 < local_100._M_string_length + __str._M_string_length)
            goto LAB_002df6bf;
            puVar17 = (undefined8 *)
                      ::std::__cxx11::string::replace
                                ((ulong)&local_100,0,(char *)0x0,(ulong)__str._M_dataplus._M_p);
          }
          else {
LAB_002df6bf:
            puVar17 = (undefined8 *)
                      ::std::__cxx11::string::_M_append
                                ((char *)&__str,(ulong)local_100._M_dataplus._M_p);
          }
          local_170._M_dataplus._M_p = (pointer)&local_170.field_2;
          puVar26 = puVar17 + 2;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*puVar17 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)puVar26) {
            local_170.field_2._M_allocated_capacity = *puVar26;
            local_170.field_2._8_8_ = puVar17[3];
          }
          else {
            local_170.field_2._M_allocated_capacity = *puVar26;
            local_170._M_dataplus._M_p = (pointer)*puVar17;
          }
          local_170._M_string_length = puVar17[1];
          *puVar17 = puVar26;
          puVar17[1] = 0;
          *(undefined1 *)puVar26 = 0;
          plVar16 = (long *)::std::__cxx11::string::append((char *)&local_170);
          in_stack_fffffffffffffe68 = local_188;
          pCVar25 = (CompilerMSL *)(plVar16 + 2);
          if ((CompilerMSL *)*plVar16 == pCVar25) {
            local_188._0_8_ = (pCVar25->super_CompilerGLSL).super_Compiler._vptr_Compiler;
            local_188._8_8_ = plVar16[3];
          }
          else {
            local_188._0_8_ = (pCVar25->super_CompilerGLSL).super_Compiler._vptr_Compiler;
            in_stack_fffffffffffffe68 = (CompilerMSL *)*plVar16;
          }
          *plVar16 = (long)pCVar25;
          plVar16[1] = 0;
          *(undefined1 *)(plVar16 + 2) = 0;
          ::std::__cxx11::string::_M_append((char *)ep_args,in_stack_fffffffffffffe68);
          if ((CompilerMSL *)in_stack_fffffffffffffe68 != (CompilerMSL *)local_188) {
            operator_delete((void *)in_stack_fffffffffffffe68);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_170._M_dataplus._M_p != &local_170.field_2) {
            operator_delete(local_170._M_dataplus._M_p);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_100._M_dataplus._M_p != &local_100.field_2) {
            operator_delete(local_100._M_dataplus._M_p);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)__str._M_dataplus._M_p != &__str.field_2) {
            operator_delete(__str._M_dataplus._M_p);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_120._M_dataplus._M_p != &local_120.field_2) {
            operator_delete(local_120._M_dataplus._M_p);
          }
        }
        bVar9 = Compiler::has_extended_decoration
                          ((Compiler *)this,id.id,SPIRVCrossDecorationBuiltInStageInputSize);
        if (bVar9) {
          if ((this->msl_options).msl_version < 0x27d8) {
            __assert_fail("msl_options.supports_msl_version(1, 2)",
                          "/workspace/llm4binary/github/license_c_cmakelists/EpicGames[P]SPIRV-Cross/spirv_msl.cpp"
                          ,0x3176,
                          "auto spirv_cross::CompilerMSL::entry_point_args_builtin(string &)::(anonymous class)::operator()(uint32_t, SPIRVariable &) const"
                         );
          }
          if (ep_args->_M_string_length != 0) {
            ::std::__cxx11::string::append((char *)ep_args);
          }
          pSVar15 = Compiler::get_variable_data_type((Compiler *)this,pSVar14);
          (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x13])
                    (&local_120,this,pSVar15,0);
          plVar16 = (long *)::std::__cxx11::string::append((char *)&local_120);
          __str._M_dataplus._M_p = (pointer)&__str.field_2;
          psVar24 = (size_type *)(plVar16 + 2);
          if ((size_type *)*plVar16 == psVar24) {
            __str.field_2._M_allocated_capacity = *psVar24;
            __str.field_2._8_8_ = plVar16[3];
          }
          else {
            __str.field_2._M_allocated_capacity = *psVar24;
            __str._M_dataplus._M_p = (pointer)*plVar16;
          }
          __str._M_string_length = plVar16[1];
          *plVar16 = (long)psVar24;
          plVar16[1] = 0;
          *(undefined1 *)(plVar16 + 2) = 0;
          CompilerGLSL::to_expression_abi_cxx11_(&local_100,&this->super_CompilerGLSL,id.id,true);
          uVar30 = 0xf;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)__str._M_dataplus._M_p != &__str.field_2) {
            uVar30 = __str.field_2._M_allocated_capacity;
          }
          in_R8 = (string *)__str._M_string_length;
          if ((ulong)uVar30 < local_100._M_string_length + __str._M_string_length) {
            uVar30 = 0xf;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_100._M_dataplus._M_p != &local_100.field_2) {
              uVar30 = local_100.field_2._M_allocated_capacity;
            }
            if ((ulong)uVar30 < local_100._M_string_length + __str._M_string_length)
            goto LAB_002df951;
            puVar17 = (undefined8 *)
                      ::std::__cxx11::string::replace
                                ((ulong)&local_100,0,(char *)0x0,(ulong)__str._M_dataplus._M_p);
          }
          else {
LAB_002df951:
            puVar17 = (undefined8 *)
                      ::std::__cxx11::string::_M_append
                                ((char *)&__str,(ulong)local_100._M_dataplus._M_p);
          }
          local_170._M_dataplus._M_p = (pointer)&local_170.field_2;
          puVar26 = puVar17 + 2;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*puVar17 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)puVar26) {
            local_170.field_2._M_allocated_capacity = *puVar26;
            local_170.field_2._8_8_ = puVar17[3];
          }
          else {
            local_170.field_2._M_allocated_capacity = *puVar26;
            local_170._M_dataplus._M_p = (pointer)*puVar17;
          }
          local_170._M_string_length = puVar17[1];
          *puVar17 = puVar26;
          puVar17[1] = 0;
          *(undefined1 *)puVar26 = 0;
          plVar16 = (long *)::std::__cxx11::string::append((char *)&local_170);
          in_stack_fffffffffffffe68 = local_188;
          pCVar25 = (CompilerMSL *)(plVar16 + 2);
          if ((CompilerMSL *)*plVar16 == pCVar25) {
            local_188._0_8_ = (pCVar25->super_CompilerGLSL).super_Compiler._vptr_Compiler;
            local_188._8_8_ = plVar16[3];
          }
          else {
            local_188._0_8_ = (pCVar25->super_CompilerGLSL).super_Compiler._vptr_Compiler;
            in_stack_fffffffffffffe68 = (CompilerMSL *)*plVar16;
          }
          *plVar16 = (long)pCVar25;
          plVar16[1] = 0;
          *(undefined1 *)(plVar16 + 2) = 0;
          ::std::__cxx11::string::_M_append((char *)ep_args,in_stack_fffffffffffffe68);
          if ((CompilerMSL *)in_stack_fffffffffffffe68 != (CompilerMSL *)local_188) {
            operator_delete((void *)in_stack_fffffffffffffe68);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_170._M_dataplus._M_p != &local_170.field_2) {
            operator_delete(local_170._M_dataplus._M_p);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_100._M_dataplus._M_p != &local_100.field_2) {
            operator_delete(local_100._M_dataplus._M_p);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)__str._M_dataplus._M_p != &__str.field_2) {
            operator_delete(__str._M_dataplus._M_p);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_120._M_dataplus._M_p != &local_120.field_2) {
            operator_delete(local_120._M_dataplus._M_p);
          }
        }
      }
LAB_002dfa90:
      lVar28 = lVar28 + 4;
    } while (sVar5 << 2 != lVar28);
  }
  ParsedIR::LoopLock::~LoopLock(&local_e0);
  if (active_builtins.super_VectorView<std::pair<spirv_cross::SPIRVariable_*,_spv::BuiltIn>_>.
      buffer_size != 0) {
    ppVar29 = active_builtins.
              super_VectorView<std::pair<spirv_cross::SPIRVariable_*,_spv::BuiltIn>_>.ptr +
              active_builtins.
              super_VectorView<std::pair<spirv_cross::SPIRVariable_*,_spv::BuiltIn>_>.buffer_size;
    ppVar31 = active_builtins.
              super_VectorView<std::pair<spirv_cross::SPIRVariable_*,_spv::BuiltIn>_>.ptr;
    do {
      uVar11 = ensure_correct_builtin_type
                         (this,*(uint32_t *)&(ppVar31->first->super_IVariant).field_0xc,
                          ppVar31->second);
      *(uint32_t *)&(ppVar31->first->super_IVariant).field_0xc = uVar11;
      ppVar31 = ppVar31 + 1;
    } while (ppVar31 != ppVar29);
  }
  if (this->needs_base_vertex_arg == Yes) {
    built_in_func_arg_abi_cxx11_
              ((string *)&stack0xfffffffffffffe68,this,BuiltInBaseVertex,
               ep_args->_M_string_length != 0);
    ::std::__cxx11::string::_M_append((char *)ep_args,in_stack_fffffffffffffe68);
    if ((CompilerMSL *)in_stack_fffffffffffffe68 != (CompilerMSL *)local_188) {
      operator_delete((void *)in_stack_fffffffffffffe68);
    }
  }
  if (this->needs_base_instance_arg == Yes) {
    built_in_func_arg_abi_cxx11_
              ((string *)&stack0xfffffffffffffe68,this,BuiltInBaseInstance,
               ep_args->_M_string_length != 0);
    ::std::__cxx11::string::_M_append((char *)ep_args,in_stack_fffffffffffffe68);
    if ((CompilerMSL *)in_stack_fffffffffffffe68 != (CompilerMSL *)local_188) {
      operator_delete((void *)in_stack_fffffffffffffe68);
    }
  }
  if (this->capture_output_to_buffer != true) goto LAB_002e0aa7;
  if ((this->stage_out_var_id).id != 0) {
    if (ep_args->_M_string_length != 0) {
      ::std::__cxx11::string::append((char *)ep_args);
    }
    pSVar14 = Variant::get<spirv_cross::SPIRVariable>
                        ((this->super_CompilerGLSL).super_Compiler.ir.ids.
                         super_VectorView<spirv_cross::Variant>.ptr + (this->stage_out_var_id).id);
    pSVar15 = Compiler::get_variable_data_type((Compiler *)this,pSVar14);
    (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x13])(&local_170,this,pSVar15,0);
    in_R8 = &this->output_buffer_var_name;
    join<char_const(&)[8],std::__cxx11::string,char_const(&)[3],std::__cxx11::string&,char_const(&)[11],unsigned_int&,char_const(&)[4]>
              ((string *)&stack0xfffffffffffffe68,(spirv_cross *)0x37b2e2,(char (*) [8])&local_170,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x364c3e,
               (char (*) [3])in_R8,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x37b28a,
               (char (*) [11])&(this->msl_options).shader_output_buffer_index,(uint *)")]]",
               (char (*) [4])in_stack_fffffffffffffe68);
    ::std::__cxx11::string::_M_append((char *)ep_args,in_stack_fffffffffffffe68);
    if ((CompilerMSL *)in_stack_fffffffffffffe68 != (CompilerMSL *)local_188) {
      operator_delete((void *)in_stack_fffffffffffffe68);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_170._M_dataplus._M_p != &local_170.field_2) {
      operator_delete(local_170._M_dataplus._M_p);
    }
  }
  EVar12 = Compiler::get_execution_model((Compiler *)this);
  if (EVar12 == ExecutionModelTessellationControl) {
    if (ep_args->_M_string_length != 0) {
      ::std::__cxx11::string::append((char *)ep_args);
    }
    join<char_const(&)[43],unsigned_int&,char_const(&)[4]>
              ((string *)&stack0xfffffffffffffe68,
               (spirv_cross *)"constant uint* spvIndirectParams [[buffer(",
               (char (*) [43])&(this->msl_options).indirect_params_buffer_index,(uint *)")]]",
               (char (*) [4])in_R8);
    ::std::__cxx11::string::_M_append((char *)ep_args,in_stack_fffffffffffffe68);
    if ((CompilerMSL *)in_stack_fffffffffffffe68 != (CompilerMSL *)local_188) {
LAB_002e01cf:
      operator_delete((void *)in_stack_fffffffffffffe68);
    }
  }
  else if (((this->stage_out_var_id).id != 0) &&
          ((EVar12 = Compiler::get_execution_model((Compiler *)this), EVar12 != ExecutionModelVertex
           || ((this->msl_options).vertex_for_tessellation == false)))) {
    if (ep_args->_M_string_length != 0) {
      ::std::__cxx11::string::append((char *)ep_args);
    }
    join<char_const(&)[41],unsigned_int&,char_const(&)[4]>
              ((string *)&stack0xfffffffffffffe68,
               (spirv_cross *)"device uint* spvIndirectParams [[buffer(",
               (char (*) [41])&(this->msl_options).indirect_params_buffer_index,(uint *)")]]",
               (char (*) [4])in_R8);
    ::std::__cxx11::string::_M_append((char *)ep_args,in_stack_fffffffffffffe68);
    if ((CompilerMSL *)in_stack_fffffffffffffe68 != (CompilerMSL *)local_188) goto LAB_002e01cf;
  }
  EVar12 = Compiler::get_execution_model((Compiler *)this);
  if ((((EVar12 == ExecutionModelVertex) && ((this->msl_options).vertex_for_tessellation == true))
      && (((this->super_CompilerGLSL).super_Compiler.active_input_builtins.lower & 0x40000000020) !=
          0)) && ((this->msl_options).vertex_index_type != None)) {
    if (ep_args->_M_string_length != 0) {
      ::std::__cxx11::string::append((char *)ep_args);
    }
    IVar3 = (this->msl_options).vertex_index_type;
    if (IVar3 == UInt32) {
      join<char_const(&)[20],std::__cxx11::string&,char_const(&)[11],unsigned_int&,char_const(&)[4]>
                ((string *)&stack0xfffffffffffffe68,(spirv_cross *)"const device uint* ",
                 (char (*) [20])&this->index_buffer_var_name,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x37b28a,
                 (char (*) [11])&(this->msl_options).shader_index_buffer_index,(uint *)")]]",
                 (char (*) [4])in_stack_fffffffffffffe68);
      ::std::__cxx11::string::_M_append((char *)ep_args,in_stack_fffffffffffffe68);
      if ((CompilerMSL *)in_stack_fffffffffffffe68 != (CompilerMSL *)local_188) {
LAB_002e02d9:
        operator_delete((void *)in_stack_fffffffffffffe68);
      }
    }
    else if (IVar3 == UInt16) {
      join<char_const(&)[22],std::__cxx11::string&,char_const(&)[11],unsigned_int&,char_const(&)[4]>
                ((string *)&stack0xfffffffffffffe68,(spirv_cross *)"const device ushort* ",
                 (char (*) [22])&this->index_buffer_var_name,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x37b28a,
                 (char (*) [11])&(this->msl_options).shader_index_buffer_index,(uint *)")]]",
                 (char (*) [4])in_stack_fffffffffffffe68);
      ::std::__cxx11::string::_M_append((char *)ep_args,in_stack_fffffffffffffe68);
      if ((CompilerMSL *)in_stack_fffffffffffffe68 != (CompilerMSL *)local_188) goto LAB_002e02d9;
    }
  }
  EVar12 = Compiler::get_execution_model((Compiler *)this);
  if (EVar12 == ExecutionModelTessellationControl) {
    if ((this->patch_stage_out_var_id).id != 0) {
      if (ep_args->_M_string_length != 0) {
        ::std::__cxx11::string::append((char *)ep_args);
      }
      pSVar14 = Variant::get<spirv_cross::SPIRVariable>
                          ((this->super_CompilerGLSL).super_Compiler.ir.ids.
                           super_VectorView<spirv_cross::Variant>.ptr +
                           (this->patch_stage_out_var_id).id);
      pSVar15 = Compiler::get_variable_data_type((Compiler *)this,pSVar14);
      (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x13])(&local_170,this,pSVar15,0);
      uVar4 = (this->msl_options).shader_patch_output_buffer_index;
      cVar10 = '\x01';
      if (9 < uVar4) {
        uVar27 = uVar4;
        cVar8 = '\x04';
        do {
          cVar10 = cVar8;
          if (uVar27 < 100) {
            cVar10 = cVar10 + -2;
            goto LAB_002e03a3;
          }
          if (uVar27 < 1000) {
            cVar10 = cVar10 + -1;
            goto LAB_002e03a3;
          }
          if (uVar27 < 10000) goto LAB_002e03a3;
          bVar9 = 99999 < uVar27;
          uVar27 = uVar27 / 10000;
          cVar8 = cVar10 + '\x04';
        } while (bVar9);
        cVar10 = cVar10 + '\x01';
      }
LAB_002e03a3:
      __str._M_dataplus._M_p = (pointer)&__str.field_2;
      ::std::__cxx11::string::_M_construct((ulong)&__str,cVar10);
      ::std::__detail::__to_chars_10_impl<unsigned_int>
                (__str._M_dataplus._M_p,(uint)__str._M_string_length,uVar4);
      join<char_const(&)[8],std::__cxx11::string,char_const(&)[3],std::__cxx11::string&,char_const(&)[11],std::__cxx11::string,char_const(&)[4]>
                ((string *)&stack0xfffffffffffffe68,(spirv_cross *)0x37b2e2,(char (*) [8])&local_170
                 ,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x364c3e,
                 (char (*) [3])&this->patch_output_buffer_var_name,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x37b28a,
                 (char (*) [11])&__str,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)")]]",
                 (char (*) [4])in_stack_fffffffffffffe68);
      ::std::__cxx11::string::_M_append((char *)ep_args,in_stack_fffffffffffffe68);
      if ((CompilerMSL *)in_stack_fffffffffffffe68 != (CompilerMSL *)local_188) {
        operator_delete((void *)in_stack_fffffffffffffe68);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)__str._M_dataplus._M_p != &__str.field_2) {
        operator_delete(__str._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_170._M_dataplus._M_p != &local_170.field_2) {
        operator_delete(local_170._M_dataplus._M_p);
      }
    }
    if (ep_args->_M_string_length != 0) {
      ::std::__cxx11::string::append((char *)ep_args);
    }
    get_tess_factor_struct_name_abi_cxx11_(&local_170,this);
    uVar4 = (this->msl_options).shader_tess_factor_buffer_index;
    cVar10 = '\x01';
    if (9 < uVar4) {
      uVar27 = uVar4;
      cVar8 = '\x04';
      do {
        cVar10 = cVar8;
        if (uVar27 < 100) {
          cVar10 = cVar10 + -2;
          goto LAB_002e04c3;
        }
        if (uVar27 < 1000) {
          cVar10 = cVar10 + -1;
          goto LAB_002e04c3;
        }
        if (uVar27 < 10000) goto LAB_002e04c3;
        bVar9 = 99999 < uVar27;
        uVar27 = uVar27 / 10000;
        cVar8 = cVar10 + '\x04';
      } while (bVar9);
      cVar10 = cVar10 + '\x01';
    }
LAB_002e04c3:
    __str._M_dataplus._M_p = (pointer)&__str.field_2;
    ::std::__cxx11::string::_M_construct((ulong)&__str,cVar10);
    ::std::__detail::__to_chars_10_impl<unsigned_int>
              (__str._M_dataplus._M_p,(uint)__str._M_string_length,uVar4);
    join<char_const(&)[8],std::__cxx11::string,char_const(&)[3],std::__cxx11::string&,char_const(&)[11],std::__cxx11::string,char_const(&)[4]>
              ((string *)&stack0xfffffffffffffe68,(spirv_cross *)0x37b2e2,(char (*) [8])&local_170,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x364c3e,
               (char (*) [3])&this->tess_factor_buffer_var_name,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x37b28a,
               (char (*) [11])&__str,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)")]]",
               (char (*) [4])in_stack_fffffffffffffe68);
    ::std::__cxx11::string::_M_append((char *)ep_args,in_stack_fffffffffffffe68);
    if ((CompilerMSL *)in_stack_fffffffffffffe68 != (CompilerMSL *)local_188) {
      operator_delete((void *)in_stack_fffffffffffffe68);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)__str._M_dataplus._M_p != &__str.field_2) {
      operator_delete(__str._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_170._M_dataplus._M_p != &local_170.field_2) {
      operator_delete(local_170._M_dataplus._M_p);
    }
    ParsedIR::create_loop_hard_lock(local_d0);
    sVar5 = (this->super_CompilerGLSL).super_Compiler.ir.ids_for_type[2].
            super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)0>_>.buffer_size;
    if (sVar5 == 0) {
      uVar4 = 0;
      uVar11 = 0;
    }
    else {
      pTVar6 = (this->super_CompilerGLSL).super_Compiler.ir.ids_for_type[2].
               super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)0>_>.ptr;
      lVar28 = 0;
      uVar4 = 0;
      uVar11 = 0;
      do {
        uVar27 = *(uint *)((long)&pTVar6->id + lVar28);
        pVVar7 = (this->super_CompilerGLSL).super_Compiler.ir.ids.
                 super_VectorView<spirv_cross::Variant>.ptr;
        if (pVVar7[uVar27].type == TypeVariable) {
          pSVar14 = Variant::get<spirv_cross::SPIRVariable>(pVVar7 + uVar27);
          bVar9 = Compiler::has_decoration
                            ((Compiler *)this,(ID)(pSVar14->super_IVariant).self.id,
                             DecorationBuiltIn);
          if ((bVar9 && pSVar14->storage == StorageClassOutput) && ((pSVar14->initializer).id != 0))
          {
            uVar13 = Compiler::get_decoration
                               ((Compiler *)this,(ID)(pSVar14->super_IVariant).self.id,
                                DecorationBuiltIn);
            if (uVar13 == 0xb) {
              uVar11 = (pSVar14->initializer).id;
            }
            else if (uVar13 == 0xc) {
              uVar4 = (pSVar14->initializer).id;
            }
          }
        }
        lVar28 = lVar28 + 4;
      } while (sVar5 << 2 != lVar28);
    }
    ParsedIR::LoopLock::~LoopLock((LoopLock *)&stack0xfffffffffffffe68);
    paVar2 = &__str.field_2;
    if (uVar11 != 0) {
      uVar18 = (ulong)uVar11;
      if ((uVar18 < (this->super_CompilerGLSL).super_Compiler.ir.ids.
                    super_VectorView<spirv_cross::Variant>.buffer_size) &&
         (pVVar7 = (this->super_CompilerGLSL).super_Compiler.ir.ids.
                   super_VectorView<spirv_cross::Variant>.ptr, pVVar7[uVar18].type == TypeConstant))
      {
        pSVar21 = Variant::get<spirv_cross::SPIRConstant>(pVVar7 + uVar18);
      }
      else {
        pSVar21 = (SPIRConstant *)0x0;
      }
      if (pSVar21 != (SPIRConstant *)0x0) {
        pSVar22 = Variant::get<spirv_cross::SPIRFunction>
                            ((this->super_CompilerGLSL).super_Compiler.ir.ids.
                             super_VectorView<spirv_cross::Variant>.ptr +
                             (this->super_CompilerGLSL).super_Compiler.ir.default_entry_point.id);
        local_188._8_8_ =
             ::std::
             _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/EpicGames[P]SPIRV-Cross/spirv_msl.cpp:12772:9)>
             ::_M_invoke;
        local_188._0_8_ =
             ::std::
             _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/EpicGames[P]SPIRV-Cross/spirv_msl.cpp:12772:9)>
             ::_M_manager;
        in_stack_fffffffffffffe68 = this;
        SmallVector<std::function<void_()>,_0UL>::push_back
                  (&pSVar22->fixup_hooks_in,(function<void_()> *)&stack0xfffffffffffffe68);
        if ((_func_int **)local_188._0_8_ != (_func_int **)0x0) {
          (*(code *)local_188._0_8_)(&stack0xfffffffffffffe68,&stack0xfffffffffffffe68,3);
        }
      }
    }
    if (uVar4 != 0) {
      uVar18 = (ulong)uVar4;
      if ((uVar18 < (this->super_CompilerGLSL).super_Compiler.ir.ids.
                    super_VectorView<spirv_cross::Variant>.buffer_size) &&
         (pVVar7 = (this->super_CompilerGLSL).super_Compiler.ir.ids.
                   super_VectorView<spirv_cross::Variant>.ptr, pVVar7[uVar18].type == TypeConstant))
      {
        pSVar21 = Variant::get<spirv_cross::SPIRConstant>(pVVar7 + uVar18);
      }
      else {
        pSVar21 = (SPIRConstant *)0x0;
      }
      if (pSVar21 != (SPIRConstant *)0x0) {
        pSVar22 = Variant::get<spirv_cross::SPIRFunction>
                            ((this->super_CompilerGLSL).super_Compiler.ir.ids.
                             super_VectorView<spirv_cross::Variant>.ptr +
                             (this->super_CompilerGLSL).super_Compiler.ir.default_entry_point.id);
        bVar9 = Compiler::is_tessellating_triangles((Compiler *)this);
        if (bVar9) {
          local_188._8_8_ =
               ::std::
               _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/EpicGames[P]SPIRV-Cross/spirv_msl.cpp:12788:42)>
               ::_M_invoke;
          local_188._0_8_ =
               ::std::
               _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/EpicGames[P]SPIRV-Cross/spirv_msl.cpp:12788:42)>
               ::_M_manager;
          in_stack_fffffffffffffe68 = this;
          SmallVector<std::function<void_()>,_0UL>::push_back
                    (&pSVar22->fixup_hooks_in,(function<void_()> *)&stack0xfffffffffffffe68);
          if ((_func_int **)local_188._0_8_ != (_func_int **)0x0) {
            (*(code *)local_188._0_8_)(&stack0xfffffffffffffe68,&stack0xfffffffffffffe68,3);
          }
        }
        else {
          local_188._8_8_ =
               ::std::
               _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/EpicGames[P]SPIRV-Cross/spirv_msl.cpp:12795:42)>
               ::_M_invoke;
          local_188._0_8_ =
               ::std::
               _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/EpicGames[P]SPIRV-Cross/spirv_msl.cpp:12795:42)>
               ::_M_manager;
          in_stack_fffffffffffffe68 = this;
          SmallVector<std::function<void_()>,_0UL>::push_back
                    (&pSVar22->fixup_hooks_in,(function<void_()> *)&stack0xfffffffffffffe68);
          if ((_func_int **)local_188._0_8_ != (_func_int **)0x0) {
            (*(code *)local_188._0_8_)(&stack0xfffffffffffffe68,&stack0xfffffffffffffe68,3);
          }
        }
      }
    }
    if ((this->stage_in_var_id).id != 0) {
      if (ep_args->_M_string_length != 0) {
        ::std::__cxx11::string::append((char *)ep_args);
      }
      if ((this->msl_options).multi_patch_workgroup == true) {
        pSVar14 = Variant::get<spirv_cross::SPIRVariable>
                            ((this->super_CompilerGLSL).super_Compiler.ir.ids.
                             super_VectorView<spirv_cross::Variant>.ptr + (this->stage_in_var_id).id
                            );
        pSVar15 = Compiler::get_variable_data_type((Compiler *)this,pSVar14);
        (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x13])(&local_170,this,pSVar15,0)
        ;
        uVar4 = (this->msl_options).shader_input_buffer_index;
        cVar10 = '\x01';
        if (9 < uVar4) {
          uVar27 = uVar4;
          cVar8 = '\x04';
          do {
            cVar10 = cVar8;
            if (uVar27 < 100) {
              cVar10 = cVar10 + -2;
              goto LAB_002e095d;
            }
            if (uVar27 < 1000) {
              cVar10 = cVar10 + -1;
              goto LAB_002e095d;
            }
            if (uVar27 < 10000) goto LAB_002e095d;
            bVar9 = 99999 < uVar27;
            uVar27 = uVar27 / 10000;
            cVar8 = cVar10 + '\x04';
          } while (bVar9);
          cVar10 = cVar10 + '\x01';
        }
LAB_002e095d:
        __str._M_dataplus._M_p = (pointer)paVar2;
        ::std::__cxx11::string::_M_construct((ulong)&__str,cVar10);
        ::std::__detail::__to_chars_10_impl<unsigned_int>
                  (__str._M_dataplus._M_p,(uint)__str._M_string_length,uVar4);
        join<char_const(&)[8],std::__cxx11::string,char_const(&)[3],std::__cxx11::string&,char_const(&)[11],std::__cxx11::string,char_const(&)[4]>
                  ((string *)&stack0xfffffffffffffe68,(spirv_cross *)0x37b2e2,
                   (char (*) [8])&local_170,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x364c3e,
                   (char (*) [3])&this->input_buffer_var_name,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x37b28a,
                   (char (*) [11])&__str,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)")]]",
                   (char (*) [4])in_stack_fffffffffffffe68);
        ::std::__cxx11::string::_M_append((char *)ep_args,in_stack_fffffffffffffe68);
        if ((CompilerMSL *)in_stack_fffffffffffffe68 != (CompilerMSL *)local_188) {
          operator_delete((void *)in_stack_fffffffffffffe68);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)__str._M_dataplus._M_p != paVar2) {
          operator_delete(__str._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_170._M_dataplus._M_p == &local_170.field_2) goto LAB_002e0aa7;
      }
      else {
        pSVar14 = Variant::get<spirv_cross::SPIRVariable>
                            ((this->super_CompilerGLSL).super_Compiler.ir.ids.
                             super_VectorView<spirv_cross::Variant>.ptr + (this->stage_in_var_id).id
                            );
        pSVar15 = Compiler::get_variable_data_type((Compiler *)this,pSVar14);
        (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x13])(&local_170,this,pSVar15,0)
        ;
        uVar4 = (this->msl_options).shader_input_wg_index;
        cVar10 = '\x01';
        if (9 < uVar4) {
          uVar27 = uVar4;
          cVar8 = '\x04';
          do {
            cVar10 = cVar8;
            if (uVar27 < 100) {
              cVar10 = cVar10 + -2;
              goto LAB_002e0a05;
            }
            if (uVar27 < 1000) {
              cVar10 = cVar10 + -1;
              goto LAB_002e0a05;
            }
            if (uVar27 < 10000) goto LAB_002e0a05;
            bVar9 = 99999 < uVar27;
            uVar27 = uVar27 / 10000;
            cVar8 = cVar10 + '\x04';
          } while (bVar9);
          cVar10 = cVar10 + '\x01';
        }
LAB_002e0a05:
        __str._M_dataplus._M_p = (pointer)paVar2;
        ::std::__cxx11::string::_M_construct((ulong)&__str,cVar10);
        ::std::__detail::__to_chars_10_impl<unsigned_int>
                  (__str._M_dataplus._M_p,(uint)__str._M_string_length,uVar4);
        join<char_const(&)[13],std::__cxx11::string,char_const(&)[3],std::__cxx11::string&,char_const(&)[16],std::__cxx11::string,char_const(&)[4]>
                  ((string *)&stack0xfffffffffffffe68,(spirv_cross *)"threadgroup ",
                   (char (*) [13])&local_170,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x364c3e,
                   (char (*) [3])&this->input_wg_var_name,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   " [[threadgroup(",(char (*) [16])&__str,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)")]]",
                   (char (*) [4])in_stack_fffffffffffffe68);
        ::std::__cxx11::string::_M_append((char *)ep_args,in_stack_fffffffffffffe68);
        if ((CompilerMSL *)in_stack_fffffffffffffe68 != (CompilerMSL *)local_188) {
          operator_delete((void *)in_stack_fffffffffffffe68);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)__str._M_dataplus._M_p != paVar2) {
          operator_delete(__str._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_170._M_dataplus._M_p == &local_170.field_2) goto LAB_002e0aa7;
      }
      operator_delete(local_170._M_dataplus._M_p);
    }
  }
LAB_002e0aa7:
  EVar12 = Compiler::get_execution_model((Compiler *)this);
  if ((EVar12 == ExecutionModelTessellationEvaluation) &&
     ((this->msl_options).raw_buffer_tese_input == true)) {
    if ((this->patch_stage_in_var_id).id != 0) {
      if (ep_args->_M_string_length != 0) {
        ::std::__cxx11::string::append((char *)ep_args);
      }
      pSVar14 = Variant::get<spirv_cross::SPIRVariable>
                          ((this->super_CompilerGLSL).super_Compiler.ir.ids.
                           super_VectorView<spirv_cross::Variant>.ptr +
                           (this->patch_stage_in_var_id).id);
      pSVar15 = Compiler::get_variable_data_type((Compiler *)this,pSVar14);
      (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x13])(&local_170,this,pSVar15,0);
      uVar4 = (this->msl_options).shader_patch_input_buffer_index;
      cVar10 = '\x01';
      if (9 < uVar4) {
        uVar27 = uVar4;
        cVar8 = '\x04';
        do {
          cVar10 = cVar8;
          if (uVar27 < 100) {
            cVar10 = cVar10 + -2;
            goto LAB_002e0b7a;
          }
          if (uVar27 < 1000) {
            cVar10 = cVar10 + -1;
            goto LAB_002e0b7a;
          }
          if (uVar27 < 10000) goto LAB_002e0b7a;
          bVar9 = 99999 < uVar27;
          uVar27 = uVar27 / 10000;
          cVar8 = cVar10 + '\x04';
        } while (bVar9);
        cVar10 = cVar10 + '\x01';
      }
LAB_002e0b7a:
      __str._M_dataplus._M_p = (pointer)&__str.field_2;
      ::std::__cxx11::string::_M_construct((ulong)&__str,cVar10);
      ::std::__detail::__to_chars_10_impl<unsigned_int>
                (__str._M_dataplus._M_p,(uint)__str._M_string_length,uVar4);
      join<char_const(&)[14],std::__cxx11::string,char_const(&)[3],std::__cxx11::string&,char_const(&)[11],std::__cxx11::string,char_const(&)[4]>
                ((string *)&stack0xfffffffffffffe68,(spirv_cross *)"const device ",
                 (char (*) [14])&local_170,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x364c3e,
                 (char (*) [3])&this->patch_input_buffer_var_name,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x37b28a,
                 (char (*) [11])&__str,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)")]]",
                 (char (*) [4])in_stack_fffffffffffffe68);
      ::std::__cxx11::string::_M_append((char *)ep_args,in_stack_fffffffffffffe68);
      if ((CompilerMSL *)in_stack_fffffffffffffe68 != (CompilerMSL *)local_188) {
        operator_delete((void *)in_stack_fffffffffffffe68);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)__str._M_dataplus._M_p != &__str.field_2) {
        operator_delete(__str._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_170._M_dataplus._M_p != &local_170.field_2) {
        operator_delete(local_170._M_dataplus._M_p);
      }
    }
    if ((this->tess_level_outer_var_id).id != 0 || (this->tess_level_inner_var_id).id != 0) {
      if (ep_args->_M_string_length != 0) {
        ::std::__cxx11::string::append((char *)ep_args);
      }
      get_tess_factor_struct_name_abi_cxx11_(&local_170,this);
      uVar4 = (this->msl_options).shader_tess_factor_buffer_index;
      cVar10 = '\x01';
      if (9 < uVar4) {
        uVar27 = uVar4;
        cVar8 = '\x04';
        do {
          cVar10 = cVar8;
          if (uVar27 < 100) {
            cVar10 = cVar10 + -2;
            goto LAB_002e0cae;
          }
          if (uVar27 < 1000) {
            cVar10 = cVar10 + -1;
            goto LAB_002e0cae;
          }
          if (uVar27 < 10000) goto LAB_002e0cae;
          bVar9 = 99999 < uVar27;
          uVar27 = uVar27 / 10000;
          cVar8 = cVar10 + '\x04';
        } while (bVar9);
        cVar10 = cVar10 + '\x01';
      }
LAB_002e0cae:
      __str._M_dataplus._M_p = (pointer)&__str.field_2;
      ::std::__cxx11::string::_M_construct((ulong)&__str,cVar10);
      ::std::__detail::__to_chars_10_impl<unsigned_int>
                (__str._M_dataplus._M_p,(uint)__str._M_string_length,uVar4);
      join<char_const(&)[14],std::__cxx11::string,char_const(&)[3],std::__cxx11::string&,char_const(&)[11],std::__cxx11::string,char_const(&)[4]>
                ((string *)&stack0xfffffffffffffe68,(spirv_cross *)"const device ",
                 (char (*) [14])&local_170,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x364c3e,
                 (char (*) [3])&this->tess_factor_buffer_var_name,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x37b28a,
                 (char (*) [11])&__str,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)")]]",
                 (char (*) [4])in_stack_fffffffffffffe68);
      ::std::__cxx11::string::_M_append((char *)ep_args,in_stack_fffffffffffffe68);
      if ((CompilerMSL *)in_stack_fffffffffffffe68 != (CompilerMSL *)local_188) {
        operator_delete((void *)in_stack_fffffffffffffe68);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)__str._M_dataplus._M_p != &__str.field_2) {
        operator_delete(__str._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_170._M_dataplus._M_p != &local_170.field_2) {
        operator_delete(local_170._M_dataplus._M_p);
      }
    }
    if ((this->stage_in_var_id).id != 0) {
      if (ep_args->_M_string_length != 0) {
        ::std::__cxx11::string::append((char *)ep_args);
      }
      pSVar14 = Variant::get<spirv_cross::SPIRVariable>
                          ((this->super_CompilerGLSL).super_Compiler.ir.ids.
                           super_VectorView<spirv_cross::Variant>.ptr + (this->stage_in_var_id).id);
      pSVar15 = Compiler::get_variable_data_type((Compiler *)this,pSVar14);
      (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x13])(&local_170,this,pSVar15,0);
      uVar4 = (this->msl_options).shader_input_buffer_index;
      cVar10 = '\x01';
      if (9 < uVar4) {
        uVar27 = uVar4;
        cVar8 = '\x04';
        do {
          cVar10 = cVar8;
          if (uVar27 < 100) {
            cVar10 = cVar10 + -2;
            goto LAB_002e0e09;
          }
          if (uVar27 < 1000) {
            cVar10 = cVar10 + -1;
            goto LAB_002e0e09;
          }
          if (uVar27 < 10000) goto LAB_002e0e09;
          bVar9 = 99999 < uVar27;
          uVar27 = uVar27 / 10000;
          cVar8 = cVar10 + '\x04';
        } while (bVar9);
        cVar10 = cVar10 + '\x01';
      }
LAB_002e0e09:
      __str._M_dataplus._M_p = (pointer)&__str.field_2;
      ::std::__cxx11::string::_M_construct((ulong)&__str,cVar10);
      ::std::__detail::__to_chars_10_impl<unsigned_int>
                (__str._M_dataplus._M_p,(uint)__str._M_string_length,uVar4);
      join<char_const(&)[14],std::__cxx11::string,char_const(&)[3],std::__cxx11::string&,char_const(&)[11],std::__cxx11::string,char_const(&)[4]>
                ((string *)&stack0xfffffffffffffe68,(spirv_cross *)"const device ",
                 (char (*) [14])&local_170,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x364c3e,
                 (char (*) [3])&this->input_buffer_var_name,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x37b28a,
                 (char (*) [11])&__str,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)")]]",
                 (char (*) [4])in_stack_fffffffffffffe68);
      ::std::__cxx11::string::_M_append((char *)ep_args,in_stack_fffffffffffffe68);
      if ((CompilerMSL *)in_stack_fffffffffffffe68 != (CompilerMSL *)local_188) {
        operator_delete((void *)in_stack_fffffffffffffe68);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)__str._M_dataplus._M_p != &__str.field_2) {
        operator_delete(__str._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_170._M_dataplus._M_p != &local_170.field_2) {
        operator_delete(local_170._M_dataplus._M_p);
      }
    }
  }
  active_builtins.super_VectorView<std::pair<spirv_cross::SPIRVariable_*,_spv::BuiltIn>_>.
  buffer_size = 0;
  if (active_builtins.super_VectorView<std::pair<spirv_cross::SPIRVariable_*,_spv::BuiltIn>_>.ptr !=
      (pair<spirv_cross::SPIRVariable_*,_spv::BuiltIn> *)&active_builtins.stack_storage) {
    free(active_builtins.super_VectorView<std::pair<spirv_cross::SPIRVariable_*,_spv::BuiltIn>_>.ptr
        );
  }
  return;
}

Assistant:

void CompilerMSL::entry_point_args_builtin(string &ep_args)
{
	// Builtin variables
	SmallVector<pair<SPIRVariable *, BuiltIn>, 8> active_builtins;
	ir.for_each_typed_id<SPIRVariable>([&](uint32_t var_id, SPIRVariable &var) {
		if (var.storage != StorageClassInput)
			return;

		auto bi_type = BuiltIn(get_decoration(var_id, DecorationBuiltIn));

		// Don't emit SamplePosition as a separate parameter. In the entry
		// point, we get that by calling get_sample_position() on the sample ID.
		if (is_builtin_variable(var) &&
		    get_variable_data_type(var).basetype != SPIRType::Struct &&
		    get_variable_data_type(var).basetype != SPIRType::ControlPointArray)
		{
			// If the builtin is not part of the active input builtin set, don't emit it.
			// Relevant for multiple entry-point modules which might declare unused builtins.
			if (!active_input_builtins.get(bi_type) || !interface_variable_exists_in_entry_point(var_id))
				return;

			// Remember this variable. We may need to correct its type.
			active_builtins.push_back(make_pair(&var, bi_type));

			if (is_direct_input_builtin(bi_type))
			{
				if (!ep_args.empty())
					ep_args += ", ";

				// Handle HLSL-style 0-based vertex/instance index.
				builtin_declaration = true;

				// Handle different MSL gl_TessCoord types. (float2, float3)
				if (bi_type == BuiltInTessCoord && get_entry_point().flags.get(ExecutionModeQuads))
					ep_args += "float2 " + to_expression(var_id) + "In";
				else
					ep_args += builtin_type_decl(bi_type, var_id) + " " + to_expression(var_id);

				ep_args += " [[" + builtin_qualifier(bi_type);
				if (bi_type == BuiltInSampleMask && get_entry_point().flags.get(ExecutionModePostDepthCoverage))
				{
					if (!msl_options.supports_msl_version(2))
						SPIRV_CROSS_THROW("Post-depth coverage requires MSL 2.0.");
					if (msl_options.is_macos() && !msl_options.supports_msl_version(2, 3))
						SPIRV_CROSS_THROW("Post-depth coverage on Mac requires MSL 2.3.");
					ep_args += ", post_depth_coverage";
				}
				ep_args += "]]";
				builtin_declaration = false;
			}
		}

		if (has_extended_decoration(var_id, SPIRVCrossDecorationBuiltInDispatchBase))
		{
			// This is a special implicit builtin, not corresponding to any SPIR-V builtin,
			// which holds the base that was passed to vkCmdDispatchBase() or vkCmdDrawIndexed(). If it's present,
			// assume we emitted it for a good reason.
			assert(msl_options.supports_msl_version(1, 2));
			if (!ep_args.empty())
				ep_args += ", ";

			ep_args += type_to_glsl(get_variable_data_type(var)) + " " + to_expression(var_id) + " [[grid_origin]]";
		}

		if (has_extended_decoration(var_id, SPIRVCrossDecorationBuiltInStageInputSize))
		{
			// This is another special implicit builtin, not corresponding to any SPIR-V builtin,
			// which holds the number of vertices and instances to draw. If it's present,
			// assume we emitted it for a good reason.
			assert(msl_options.supports_msl_version(1, 2));
			if (!ep_args.empty())
				ep_args += ", ";

			ep_args += type_to_glsl(get_variable_data_type(var)) + " " + to_expression(var_id) + " [[grid_size]]";
		}
	});

	// Correct the types of all encountered active builtins. We couldn't do this before
	// because ensure_correct_builtin_type() may increase the bound, which isn't allowed
	// while iterating over IDs.
	for (auto &var : active_builtins)
		var.first->basetype = ensure_correct_builtin_type(var.first->basetype, var.second);

	// Handle HLSL-style 0-based vertex/instance index.
	if (needs_base_vertex_arg == TriState::Yes)
		ep_args += built_in_func_arg(BuiltInBaseVertex, !ep_args.empty());

	if (needs_base_instance_arg == TriState::Yes)
		ep_args += built_in_func_arg(BuiltInBaseInstance, !ep_args.empty());

	if (capture_output_to_buffer)
	{
		// Add parameters to hold the indirect draw parameters and the shader output. This has to be handled
		// specially because it needs to be a pointer, not a reference.
		if (stage_out_var_id)
		{
			if (!ep_args.empty())
				ep_args += ", ";
			ep_args += join("device ", type_to_glsl(get_stage_out_struct_type()), "* ", output_buffer_var_name,
			                " [[buffer(", msl_options.shader_output_buffer_index, ")]]");
		}

		if (is_tesc_shader())
		{
			if (!ep_args.empty())
				ep_args += ", ";
			ep_args +=
			    join("constant uint* spvIndirectParams [[buffer(", msl_options.indirect_params_buffer_index, ")]]");
		}
		else if (stage_out_var_id &&
		         !(get_execution_model() == ExecutionModelVertex && msl_options.vertex_for_tessellation))
		{
			if (!ep_args.empty())
				ep_args += ", ";
			ep_args +=
			    join("device uint* spvIndirectParams [[buffer(", msl_options.indirect_params_buffer_index, ")]]");
		}

		if (get_execution_model() == ExecutionModelVertex && msl_options.vertex_for_tessellation &&
		    (active_input_builtins.get(BuiltInVertexIndex) || active_input_builtins.get(BuiltInVertexId)) &&
		    msl_options.vertex_index_type != Options::IndexType::None)
		{
			// Add the index buffer so we can set gl_VertexIndex correctly.
			if (!ep_args.empty())
				ep_args += ", ";
			switch (msl_options.vertex_index_type)
			{
			case Options::IndexType::None:
				break;
			case Options::IndexType::UInt16:
				ep_args += join("const device ushort* ", index_buffer_var_name, " [[buffer(",
				                msl_options.shader_index_buffer_index, ")]]");
				break;
			case Options::IndexType::UInt32:
				ep_args += join("const device uint* ", index_buffer_var_name, " [[buffer(",
				                msl_options.shader_index_buffer_index, ")]]");
				break;
			}
		}

		// Tessellation control shaders get three additional parameters:
		// a buffer to hold the per-patch data, a buffer to hold the per-patch
		// tessellation levels, and a block of workgroup memory to hold the
		// input control point data.
		if (is_tesc_shader())
		{
			if (patch_stage_out_var_id)
			{
				if (!ep_args.empty())
					ep_args += ", ";
				ep_args +=
				    join("device ", type_to_glsl(get_patch_stage_out_struct_type()), "* ", patch_output_buffer_var_name,
				         " [[buffer(", convert_to_string(msl_options.shader_patch_output_buffer_index), ")]]");
			}
			if (!ep_args.empty())
				ep_args += ", ";
			ep_args += join("device ", get_tess_factor_struct_name(), "* ", tess_factor_buffer_var_name, " [[buffer(",
			                convert_to_string(msl_options.shader_tess_factor_buffer_index), ")]]");

			// Initializer for tess factors must be handled specially since it's never declared as a normal variable.
			uint32_t outer_factor_initializer_id = 0;
			uint32_t inner_factor_initializer_id = 0;
			ir.for_each_typed_id<SPIRVariable>([&](uint32_t, SPIRVariable &var) {
				if (!has_decoration(var.self, DecorationBuiltIn) || var.storage != StorageClassOutput || !var.initializer)
					return;

				BuiltIn builtin = BuiltIn(get_decoration(var.self, DecorationBuiltIn));
				if (builtin == BuiltInTessLevelInner)
					inner_factor_initializer_id = var.initializer;
				else if (builtin == BuiltInTessLevelOuter)
					outer_factor_initializer_id = var.initializer;
			});

			const SPIRConstant *c = nullptr;

			if (outer_factor_initializer_id && (c = maybe_get<SPIRConstant>(outer_factor_initializer_id)))
			{
				auto &entry_func = get<SPIRFunction>(ir.default_entry_point);
				entry_func.fixup_hooks_in.push_back(
				    [=]()
				    {
					    uint32_t components = is_tessellating_triangles() ? 3 : 4;
					    for (uint32_t i = 0; i < components; i++)
					    {
						    statement(builtin_to_glsl(BuiltInTessLevelOuter, StorageClassOutput), "[", i,
						              "] = ", "half(", to_expression(c->subconstants[i]), ");");
					    }
				    });
			}

			if (inner_factor_initializer_id && (c = maybe_get<SPIRConstant>(inner_factor_initializer_id)))
			{
				auto &entry_func = get<SPIRFunction>(ir.default_entry_point);
				if (is_tessellating_triangles())
				{
					entry_func.fixup_hooks_in.push_back([=]() {
						statement(builtin_to_glsl(BuiltInTessLevelInner, StorageClassOutput), " = ", "half(",
						          to_expression(c->subconstants[0]), ");");
					});
				}
				else
				{
					entry_func.fixup_hooks_in.push_back([=]() {
						for (uint32_t i = 0; i < 2; i++)
						{
							statement(builtin_to_glsl(BuiltInTessLevelInner, StorageClassOutput), "[", i, "] = ",
							          "half(", to_expression(c->subconstants[i]), ");");
						}
					});
				}
			}

			if (stage_in_var_id)
			{
				if (!ep_args.empty())
					ep_args += ", ";
				if (msl_options.multi_patch_workgroup)
				{
					ep_args += join("device ", type_to_glsl(get_stage_in_struct_type()), "* ", input_buffer_var_name,
					                " [[buffer(", convert_to_string(msl_options.shader_input_buffer_index), ")]]");
				}
				else
				{
					ep_args += join("threadgroup ", type_to_glsl(get_stage_in_struct_type()), "* ", input_wg_var_name,
					                " [[threadgroup(", convert_to_string(msl_options.shader_input_wg_index), ")]]");
				}
			}
		}
	}
	// Tessellation evaluation shaders get three additional parameters:
	// a buffer for the per-patch data, a buffer for the per-patch
	// tessellation levels, and a buffer for the control point data.
	if (is_tese_shader() && msl_options.raw_buffer_tese_input)
	{
		if (patch_stage_in_var_id)
		{
			if (!ep_args.empty())
				ep_args += ", ";
			ep_args +=
			    join("const device ", type_to_glsl(get_patch_stage_in_struct_type()), "* ", patch_input_buffer_var_name,
			         " [[buffer(", convert_to_string(msl_options.shader_patch_input_buffer_index), ")]]");
		}

		if (tess_level_inner_var_id || tess_level_outer_var_id)
		{
			if (!ep_args.empty())
				ep_args += ", ";
			ep_args += join("const device ", get_tess_factor_struct_name(), "* ", tess_factor_buffer_var_name,
			                " [[buffer(", convert_to_string(msl_options.shader_tess_factor_buffer_index), ")]]");
		}

		if (stage_in_var_id)
		{
			if (!ep_args.empty())
				ep_args += ", ";
			ep_args += join("const device ", type_to_glsl(get_stage_in_struct_type()), "* ", input_buffer_var_name,
			                " [[buffer(", convert_to_string(msl_options.shader_input_buffer_index), ")]]");
		}
	}
}